

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_map_forEach(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue v;
  JSValue v_00;
  JSValue this_obj;
  JSValue func_obj;
  JSValue JVar1;
  JSValueUnion JVar2;
  JSValue *pJVar3;
  undefined4 uVar4;
  int iVar5;
  void *pvVar6;
  JSValueUnion JVar7;
  int in_ECX;
  JSContext *in_RDI;
  int in_R9D;
  JSValue JVar8;
  JSValue JVar9;
  JSMapRecord *mr;
  list_head *el;
  JSValue args [3];
  JSValue ret;
  JSValue this_arg;
  JSValue func;
  JSMapState *s;
  JSValueUnion *mr_00;
  JSContext *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar10;
  JSClassID in_stack_ffffffffffffff0c;
  undefined4 uVar11;
  JSValueUnion in_stack_ffffffffffffff10;
  int64_t iVar12;
  JSValueUnion in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  JSValue *argv_00;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int64_t in_stack_ffffffffffffff40;
  long lVar13;
  JSValueUnion local_a8;
  JSValue *local_a0;
  JSValueUnion local_98;
  undefined4 local_10;
  undefined4 uStack_c;
  int64_t local_8;
  
  JVar8.tag = in_stack_ffffffffffffff20;
  JVar8.u.ptr = in_stack_ffffffffffffff18.ptr;
  pvVar6 = JS_GetOpaque2(in_stack_ffffffffffffff10.ptr,JVar8,in_stack_ffffffffffffff0c);
  uVar4 = uStack_c;
  if (pvVar6 == (void *)0x0) {
    local_10 = 0;
    local_8 = 6;
  }
  else {
    if (in_ECX < 2) {
      in_stack_ffffffffffffff38 = 0;
      in_stack_ffffffffffffff40 = 3;
    }
    JVar9.tag = (int64_t)in_stack_ffffffffffffff18.ptr;
    JVar9.u.ptr = in_stack_ffffffffffffff10.ptr;
    iVar5 = check_function((JSContext *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),JVar9);
    if (iVar5 == 0) {
      lVar13 = *(long *)((long)pvVar6 + 0x10);
      while (lVar13 != (long)pvVar6 + 8) {
        JVar7.ptr = (void *)(lVar13 + -0x18);
        if (*(int *)(lVar13 + -0x14) == 0) {
          *(int *)JVar7.ptr = *JVar7.ptr + 1;
          JVar8 = JS_DupValue(in_RDI,*(JSValue *)(lVar13 + 0x20));
          local_98 = JVar8.u;
          argv_00 = (JSValue *)JVar8.tag;
          JVar2 = local_98;
          pJVar3 = argv_00;
          if (in_R9D == 0) {
            JVar9 = JS_DupValue(in_RDI,*(JSValue *)((long)JVar7.ptr + 0x48));
            JVar2 = JVar9.u;
            pJVar3 = (JSValue *)JVar9.tag;
          }
          local_a0 = pJVar3;
          local_a8 = JVar2;
          mr_00 = &local_a8;
          func_obj.tag = lVar13;
          func_obj.u.ptr = JVar7.ptr;
          this_obj.u._4_4_ = in_stack_ffffffffffffff3c;
          this_obj.u.int32 = in_stack_ffffffffffffff38;
          this_obj.tag = in_stack_ffffffffffffff40;
          JVar8 = JS_Call((JSContext *)JVar8.tag,func_obj,this_obj,JVar8.u._4_4_,argv_00);
          local_10 = JVar8.u._0_4_;
          local_8 = JVar8.tag;
          uVar10 = local_10;
          uVar11 = JVar8.u._4_4_;
          iVar12 = local_8;
          JS_FreeValue(in_stack_ffffffffffffff00,JVar8);
          if (in_R9D == 0) {
            v.u._4_4_ = uVar11;
            v.u.int32 = uVar10;
            v.tag = iVar12;
            JS_FreeValue(in_stack_ffffffffffffff00,v);
          }
          lVar13 = *(long *)(lVar13 + 8);
          map_decref_record((JSRuntime *)in_stack_ffffffffffffff00,(JSMapRecord *)mr_00);
          iVar5 = JS_IsException(JVar8);
          uVar4 = JVar8.u._4_4_;
          if (iVar5 != 0) goto LAB_0017e735;
          v_00.u._4_4_ = uVar11;
          v_00.u.int32 = uVar10;
          v_00.tag = iVar12;
          JS_FreeValue(in_stack_ffffffffffffff00,v_00);
        }
        else {
          lVar13 = *(long *)(lVar13 + 8);
        }
      }
      local_10 = 0;
      local_8 = 3;
      uVar4 = uStack_c;
    }
    else {
      local_10 = 0;
      local_8 = 6;
    }
  }
LAB_0017e735:
  uStack_c = uVar4;
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue js_map_forEach(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSValueConst func, this_arg;
    JSValue ret, args[3];
    struct list_head *el;
    JSMapRecord *mr;

    if (!s)
        return JS_EXCEPTION;
    func = argv[0];
    if (argc > 1)
        this_arg = argv[1];
    else
        this_arg = JS_UNDEFINED;
    if (check_function(ctx, func))
        return JS_EXCEPTION;
    /* Note: the list can be modified while traversing it, but the
       current element is locked */
    el = s->records.next;
    while (el != &s->records) {
        mr = list_entry(el, JSMapRecord, link);
        if (!mr->empty) {
            mr->ref_count++;
            /* must duplicate in case the record is deleted */
            args[1] = JS_DupValue(ctx, mr->key);
            if (magic)
                args[0] = args[1];
            else
                args[0] = JS_DupValue(ctx, mr->value);
            args[2] = (JSValue)this_val;
            ret = JS_Call(ctx, func, this_arg, 3, (JSValueConst *)args);
            JS_FreeValue(ctx, args[0]);
            if (!magic)
                JS_FreeValue(ctx, args[1]);
            el = el->next;
            map_decref_record(ctx->rt, mr);
            if (JS_IsException(ret))
                return ret;
            JS_FreeValue(ctx, ret);
        } else {
            el = el->next;
        }
    }
    return JS_UNDEFINED;
}